

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
tf::SmallVectorImpl<tf::Node_*>::swap
          (SmallVectorImpl<tf::Node_*> *this,SmallVectorImpl<tf::Node_*> *RHS)

{
  U *FirstEl;
  U *FirstEl_00;
  void *pvVar1;
  void *pvVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined1 *__dest;
  size_t MinSizeInBytes;
  undefined1 *__dest_00;
  undefined1 *puVar5;
  undefined1 *puVar6;
  size_t EltDiff_1;
  ulong uVar7;
  size_t EltDiff;
  ulong uVar8;
  
  if (this != RHS) {
    puVar5 = (undefined1 *)
             (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    FirstEl = &(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    puVar6 = (undefined1 *)
             (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    FirstEl_00 = &(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    if ((U *)puVar6 == FirstEl_00 || (U *)puVar5 == FirstEl) {
      MinSizeInBytes =
           (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
           (long)puVar6;
      if ((ulong)((long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                        CapacityX - (long)puVar5) < MinSizeInBytes) {
        SmallVectorBase::grow_pod((SmallVectorBase *)this,FirstEl,MinSizeInBytes,8);
        puVar5 = (undefined1 *)
                 (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        puVar6 = (undefined1 *)
                 (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      }
      __dest_00 = (undefined1 *)
                  (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      uVar4 = (long)__dest_00 - (long)puVar5;
      if ((ulong)((long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                        CapacityX - (long)puVar6) < uVar4) {
        SmallVectorBase::grow_pod((SmallVectorBase *)RHS,FirstEl_00,uVar4,8);
        puVar5 = (undefined1 *)
                 (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        __dest_00 = (undefined1 *)
                    (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
        puVar6 = (undefined1 *)
                 (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        uVar4 = (long)__dest_00 - (long)puVar5;
      }
      uVar4 = (long)uVar4 >> 3;
      __dest = (undefined1 *)
               (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      uVar7 = (long)__dest - (long)puVar6 >> 3;
      uVar8 = uVar7;
      if (uVar4 < uVar7) {
        uVar8 = uVar4;
      }
      if (uVar8 != 0) {
        uVar4 = 0;
        do {
          pvVar1 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
          pvVar2 = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
          uVar3 = *(undefined8 *)((long)pvVar1 + uVar4 * 8);
          *(undefined8 *)((long)pvVar1 + uVar4 * 8) = *(undefined8 *)((long)pvVar2 + uVar4 * 8);
          *(undefined8 *)((long)pvVar2 + uVar4 * 8) = uVar3;
          uVar4 = uVar4 + 1;
        } while (uVar8 != uVar4);
        puVar5 = (undefined1 *)
                 (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        __dest_00 = (undefined1 *)
                    (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
        puVar6 = (undefined1 *)
                 (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        __dest = (undefined1 *)
                 (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
        uVar4 = (long)__dest_00 - (long)puVar5 >> 3;
        uVar7 = (long)__dest - (long)puVar6 >> 3;
      }
      if (uVar4 < uVar7 || uVar4 - uVar7 == 0) {
        if (uVar4 <= uVar7 && uVar7 - uVar4 != 0) {
          puVar5 = puVar6 + uVar8 * 8;
          if (puVar5 != __dest) {
            memcpy(__dest_00,puVar5,(long)__dest - (long)puVar5);
            __dest_00 = (undefined1 *)
                        (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX
            ;
            puVar6 = (undefined1 *)
                     (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                     super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
          }
          (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
               __dest_00 + (uVar7 - uVar4) * 8;
          (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
               puVar6 + uVar8 * 8;
        }
      }
      else {
        puVar6 = puVar5 + uVar8 * 8;
        if (puVar6 != __dest_00) {
          memcpy(__dest,puVar6,(long)__dest_00 - (long)puVar6);
          __dest = (undefined1 *)
                   (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
          puVar5 = (undefined1 *)
                   (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        }
        (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
             __dest + (uVar4 - uVar7) * 8;
        (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
             puVar5 + uVar8 * 8;
      }
    }
    else {
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = puVar6;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = puVar5;
      pvVar1 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
           (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pvVar1;
      pvVar1 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX;
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
           (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX = pvVar1;
    }
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->EndX, RHS.EndX);
    std::swap(this->CapacityX, RHS.CapacityX);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.setEnd(RHS.end()+EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->setEnd(this->begin()+NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->setEnd(this->end() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.setEnd(RHS.begin()+NumShared);
  }
}